

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

bool __thiscall re2::Regexp::ComputeSimple(Regexp *this)

{
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar1;
  byte bVar2;
  CharClassBuilder *pCVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  int i;
  ulong uVar7;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar8;
  LogMessage LStack_188;
  
  bVar4 = 1;
  switch(this->op_) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    break;
  case '\x05':
  case '\x06':
    if ((ulong)this->nsub_ < 2) {
      paVar8 = &this->field_5;
    }
    else {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    uVar7 = 0;
    do {
      bVar4 = this->nsub_ == uVar7;
      if ((bool)bVar4) break;
      paVar1 = paVar8 + uVar7;
      uVar7 = uVar7 + 1;
    } while (paVar1->subone_->simple_ != '\0');
    break;
  case '\a':
  case '\b':
  case '\t':
    if (this->nsub_ < 2) {
      paVar8 = &this->field_5;
    }
    else {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (paVar8->subone_->simple_ != '\0') {
      bVar2 = paVar8->subone_->op_;
      if (bVar2 < 10) {
        bVar4 = (byte)(0x79 >> (bVar2 & 0x1f));
      }
      break;
    }
  case '\n':
switchD_001bb3d5_caseD_a:
    bVar4 = 0;
    break;
  case '\v':
    if (this->nsub_ < 2) {
      paVar8 = &this->field_5;
    }
    else {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    bVar4 = paVar8->subone_->simple_ != '\0';
    break;
  case '\x14':
    pCVar3 = (this->field_7).field_3.ccb_;
    if (pCVar3 == (CharClassBuilder *)0x0) {
      iVar5 = *(int *)((this->field_7).field_3.cc_ + 4);
    }
    else {
      iVar5 = pCVar3->nrunes_;
    }
    bVar4 = iVar5 != 0x110000 && iVar5 != 0;
    break;
  default:
    LogMessage::LogMessage
              (&LStack_188,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/simplify.cc"
               ,99);
    poVar6 = std::operator<<((ostream *)&LStack_188.str_,"Case not handled in ComputeSimple: ");
    std::operator<<(poVar6,this->op_);
    LogMessage::~LogMessage(&LStack_188);
    goto switchD_001bb3d5_caseD_a;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool Regexp::ComputeSimple() {
  Regexp** subs;
  switch (op_) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      return true;
    case kRegexpConcat:
    case kRegexpAlternate:
      // These are simple as long as the subpieces are simple.
      subs = sub();
      for (int i = 0; i < nsub_; i++)
        if (!subs[i]->simple())
          return false;
      return true;
    case kRegexpCharClass:
      // Simple as long as the char class is not empty, not full.
      if (ccb_ != NULL)
        return !ccb_->empty() && !ccb_->full();
      return !cc_->empty() && !cc_->full();
    case kRegexpCapture:
      subs = sub();
      return subs[0]->simple();
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      subs = sub();
      if (!subs[0]->simple())
        return false;
      switch (subs[0]->op_) {
        case kRegexpStar:
        case kRegexpPlus:
        case kRegexpQuest:
        case kRegexpEmptyMatch:
        case kRegexpNoMatch:
          return false;
        default:
          break;
      }
      return true;
    case kRegexpRepeat:
      return false;
  }
  LOG(DFATAL) << "Case not handled in ComputeSimple: " << op_;
  return false;
}